

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O2

void __thiscall helics::tcp::TcpComms::~TcpComms(TcpComms *this)

{
  CommsInterface::disconnect((CommsInterface *)this);
  gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  ~BlockingQueue(&this->rxMessageQueue);
  std::__cxx11::string::~string((string *)&this->encryption_config);
  NetworkCommsInterface::~NetworkCommsInterface(&this->super_NetworkCommsInterface);
  return;
}

Assistant:

TcpComms::~TcpComms()
{
    disconnect();
}